

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::EnsureLocalVarSlots(Func *this)

{
  code *pcVar1;
  bool bVar2;
  CodeGenWorkItemType CVar3;
  RegSlot RVar4;
  int32 iVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  
  bVar2 = IsJitInDebugMode(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x2eb,"(IsJitInDebugMode())","IsJitInDebugMode()");
    if (!bVar2) goto LAB_004098fe;
    *puVar6 = 0;
  }
  if (this->m_localVarSlotsOffset == -1) {
    this_00 = GetJITFunctionBody(this);
    RVar4 = JITTimeFunctionBody::GetNonTempLocalVarCount(this_00);
    if ((RVar4 != 0) && (this->m_localVarSlotsOffset == -1)) {
      iVar5 = StackAllocate(this,RVar4 << 3);
      this->m_localVarSlotsOffset = iVar5;
      iVar5 = StackAllocate(this,8);
      this->m_hasLocalVarChangedOffset = iVar5;
      CVar3 = JITTimeWorkItem::Type(this->m_workItem);
      if (CVar3 != JsFunctionType) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x2f7,"(m_workItem->Type() == JsFunctionType)",
                           "m_workItem->Type() == JsFunctionType");
        if (!bVar2) {
LAB_004098fe:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      JITOutput::SetVarSlotsOffset(&this->m_output,this->m_localVarSlotsOffset + -0x10);
      JITOutput::SetVarChangedOffset(&this->m_output,this->m_hasLocalVarChangedOffset + -0x10);
      return;
    }
  }
  return;
}

Assistant:

void
Func::EnsureLocalVarSlots()
{
    Assert(IsJitInDebugMode());

    if (!this->HasLocalVarSlotCreated())
    {
        uint32 localSlotCount = GetJITFunctionBody()->GetNonTempLocalVarCount();
        if (localSlotCount && m_localVarSlotsOffset == Js::Constants::InvalidOffset)
        {
            // Allocate the slots.
            int32 size = localSlotCount * GetDiagLocalSlotSize();
            m_localVarSlotsOffset = StackAllocate(size);
            m_hasLocalVarChangedOffset = StackAllocate(max(1, MachStackAlignment)); // Can't alloc less than StackAlignment bytes.

            Assert(m_workItem->Type() == JsFunctionType);

            m_output.SetVarSlotsOffset(AdjustOffsetValue(m_localVarSlotsOffset));
            m_output.SetVarChangedOffset(AdjustOffsetValue(m_hasLocalVarChangedOffset));
        }
    }
}